

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

void __thiscall
duckdb::Serializer::WriteValue<duckdb::DataPointer>
          (Serializer *this,vector<duckdb::DataPointer,_true> *vec)

{
  pointer pDVar1;
  long lVar2;
  DataPointer *item;
  pointer value;
  
  lVar2 = (long)(vec->super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>).
                super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(vec->super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>).
                super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>.
                _M_impl.super__Vector_impl_data._M_start;
  (*this->_vptr_Serializer[8])(this,lVar2 / 0x88,lVar2 % 0x88);
  pDVar1 = (vec->super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>).
           super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (value = (vec->super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>).
               super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl
               .super__Vector_impl_data._M_start; value != pDVar1; value = value + 1) {
    WriteValue<duckdb::DataPointer>(this,value);
  }
  (*this->_vptr_Serializer[9])(this);
  return;
}

Assistant:

void WriteValue(const vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}